

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O1

int Pm_Read(PortMidiStream *stream,PmEvent *buffer,int32_t length)

{
  int iVar1;
  PmError PVar2;
  int iVar3;
  int iVar4;
  
  pm_hosterror = 0;
  iVar1 = -0x270b;
  if (stream != (PortMidiStream *)0x0) {
    if ((descriptors[*stream].pub.opened != 0) && (descriptors[*stream].pub.input != 0)) {
      iVar1 = (**(code **)(*(long *)((long)stream + 0x50) + 0x50))(stream);
    }
  }
  if (iVar1 == -10000) {
    (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100);
    pm_hosterror = 1;
  }
  else if (iVar1 == 0) {
    iVar4 = 0;
    do {
      if (length <= iVar4) goto LAB_001048f2;
      PVar2 = Pm_Dequeue(*(PmQueue **)((long)stream + 0x20),buffer);
      if (PVar2 == pmBufferOverflow) {
        iVar3 = 1;
      }
      else if (PVar2 == pmNoData) {
        iVar3 = 3;
      }
      else {
        iVar4 = iVar4 + 1;
        iVar3 = 0;
      }
      buffer = buffer + 1;
    } while (iVar3 == 0);
    iVar1 = -0x270c;
    if (iVar3 == 3) {
LAB_001048f2:
      iVar1 = iVar4;
    }
  }
  return iVar1;
}

Assistant:

PMEXPORT int Pm_Read(PortMidiStream *stream, PmEvent *buffer, int32_t length) {
    PmInternal *midi = (PmInternal *) stream;
    int n = 0;
    PmError err = pmNoError;
    pm_hosterror = FALSE;
    /* arg checking */
    if(midi == NULL)
        err = pmBadPtr;
    else if(!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else if(!descriptors[midi->device_id].pub.input)
        err = pmBadPtr;    
    /* First poll for data in the buffer...
     * This either simply checks for data, or attempts first to fill the buffer
     * with data from the MIDI hardware; this depends on the implementation.
     * We could call Pm_Poll here, but that would redo a lot of redundant
     * parameter checking, so I copied some code from Pm_Poll to here: */
    else err = (*(midi->dictionary->poll))(midi);

    if (err != pmNoError) {
        if (err == pmHostError) {
            midi->dictionary->host_error(midi, pm_hosterror_text, 
                                         PM_HOST_ERROR_MSG_LEN);
          pm_hosterror = TRUE;
        }
        return pm_errmsg(err);
    }

    while (n < length) {
        PmError err = Pm_Dequeue(midi->queue, buffer++);
        if (err == pmBufferOverflow) {
            /* ignore the data we have retreived so far */
            return pm_errmsg(pmBufferOverflow);
        } else if (err == 0) { /* empty queue */
            break;
        }
        n++;
    }
    return n;
}